

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

int rw::null::deviceSystem(DeviceReq req,void *arg0,int32 n)

{
  if (req - DEVICEGETNUMSUBSYSTEMS < 4) {
    return *(int *)(&DAT_0012ec58 + (ulong)(req - DEVICEGETNUMSUBSYSTEMS) * 4);
  }
  return 1;
}

Assistant:

int
deviceSystem(DeviceReq req, void *arg0, int32 n)
{
	switch(req){
	case DEVICEGETNUMSUBSYSTEMS:
		return 0;
	case DEVICEGETCURRENTSUBSYSTEM:
		return 0;
	case DEVICEGETSUBSSYSTEMINFO:
		return 0;
	default: break;
	}
	return 1;
}